

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:819:9)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  undefined8 this;
  OutputWorker *this_00;
  bool bVar1;
  Result result;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_std::error_code,_unsigned_long>
  handler;
  ptr p;
  undefined1 local_1f8 [16];
  long local_1e8;
  undefined1 local_1e0 [48];
  ptr local_1b0;
  undefined1 local_198 [16];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  local_1e0._16_8_ = base[4].next_;
  local_1b0.h = (anon_class_8_1_8991fb9c *)(local_1e0 + 0x10);
  local_1e0._24_8_ = base[1].next_;
  local_1e0._32_8_ = base[1].func_;
  local_1e0._40_8_ = *(undefined8 *)&base[1].task_result_;
  local_1b0.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9)>
                 *)base;
  local_1b0.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9)>
                 *)base;
  ptr::reset(&local_1b0);
  this = local_1e0._16_8_;
  if (owner != (void *)0x0) {
    if (local_1e0._24_4_ == ipv4) {
      if (local_1e0._40_8_ == 0) goto LAB_0015e4cd;
    }
    else {
      if ((((endpoint *)(local_1e0._16_8_ + 0x68))->impl_).data_.base.sa_family == 2) {
        bVar1 = *(int *)(local_1e0._16_8_ + 0x6c) == 0;
      }
      else {
        bVar1 = *(undefined1 (*) [16])(local_1e0._16_8_ + 0x70) == (undefined1  [16])0x0;
      }
      if ((local_1e0._40_8_ == 0) || (bVar1)) goto LAB_0015e4cd;
    }
    tonk::gateway::SSDPRequester::OnUDPDatagram
              ((SSDPRequester *)local_1f8,(char *)local_1e0._16_8_,(int)local_1e0._16_8_ + 0xa0);
    if ((StateMachine *)local_1f8._0_8_ != (StateMachine *)0x0) {
      tonk::Result::ToJson_abi_cxx11_((string *)(local_1f8 + 8),(Result *)local_1f8);
      if (DAT_001e6cd0 < 4) {
        local_198._0_8_ = tonk::gateway::ModuleLogger._M_head_impl;
        local_198._8_4_ = 3;
        std::__cxx11::ostringstream::ostringstream(local_188);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_188,DAT_001e6d00,DAT_001e6d08);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_188,"SSDP datagram rejected: ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_188,(char *)local_1f8._8_8_,local_1e8);
        this_00 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_198);
        std::__cxx11::ostringstream::~ostringstream(local_188);
        std::ios_base::~ios_base(local_118);
      }
      if ((AsioHost *)local_1f8._8_8_ != (AsioHost *)local_1e0) {
        operator_delete((void *)local_1f8._8_8_);
      }
    }
    tonk::gateway::SSDPRequester::PostNextRead_UDP((SSDPRequester *)this);
    tonk::Result::~Result((Result *)local_1f8);
  }
LAB_0015e4cd:
  ptr::reset(&local_1b0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_recvfrom_op* o(
        static_cast<reactive_socket_recvfrom_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }